

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

double __thiscall libsgp4::DateTime::ToGreenwichSiderealTime(DateTime *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double gt;
  double jdf;
  double t;
  double jd0;
  DateTime *this_local;
  
  dVar1 = ToJulian(this);
  dVar1 = floor(dVar1 + 0.5);
  dVar2 = ((dVar1 - 0.5) - 2451545.0) / 36525.0;
  dVar3 = ToJulian(this);
  dVar1 = Util::DegreesToRadians
                    (((dVar3 - (dVar1 - 0.5)) * 1.00273790935 * 86400.0 +
                     dVar2 * (dVar2 * (-dVar2 * 6.2e-06 + 0.093104) + 8640184.812866) + 24110.54841)
                     / 240.0);
  dVar1 = Util::WrapTwoPI(dVar1);
  return dVar1;
}

Assistant:

double ToGreenwichSiderealTime() const
    {
        // julian date of previous midnight
        double jd0 = floor(ToJulian() + 0.5) - 0.5;
        // julian centuries since epoch
        double t   = (jd0 - 2451545.0) / 36525.0;
        double jdf = ToJulian() - jd0;

        double gt  = 24110.54841 + t * (8640184.812866 + t * (0.093104 - t * 6.2E-6));
        gt  += jdf * 1.00273790935 * 86400.0;

        // 360.0 / 86400.0 = 1.0 / 240.0
        return Util::WrapTwoPI(Util::DegreesToRadians(gt / 240.0));
    }